

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void av1_alloc_mb_wiener_var_pred_buf(AV1_COMMON *cm,ThreadData_conflict *td)

{
  void *pvVar1;
  size_t in_RSI;
  size_t in_RDI;
  size_t buf_size;
  int buf_height;
  int buf_width;
  int is_high_bitdepth;
  
  is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  pvVar1 = aom_memalign(in_RDI,in_RSI);
  *(void **)(in_RSI + 0x25d48) = pvVar1;
  if (*(long *)(in_RSI + 0x25d48) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate td->wiener_tmp_pred_buf");
  }
  return;
}

Assistant:

void av1_alloc_mb_wiener_var_pred_buf(AV1_COMMON *cm, ThreadData *td) {
  const int is_high_bitdepth = is_cur_buf_hbd(&td->mb.e_mbd);
  assert(MB_WIENER_PRED_BLOCK_SIZE < BLOCK_SIZES_ALL);
  const int buf_width = block_size_wide[MB_WIENER_PRED_BLOCK_SIZE];
  const int buf_height = block_size_high[MB_WIENER_PRED_BLOCK_SIZE];
  assert(buf_width == MB_WIENER_PRED_BUF_STRIDE);
  const size_t buf_size =
      (buf_width * buf_height * sizeof(*td->wiener_tmp_pred_buf))
      << is_high_bitdepth;
  CHECK_MEM_ERROR(cm, td->wiener_tmp_pred_buf, aom_memalign(32, buf_size));
}